

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

_Bool hd_anchor_eq(fy_accel *xl,void *hash,void *key1,void *key2,void *userdata)

{
  int iVar1;
  size_t local_68;
  size_t len2;
  size_t len1;
  char *text2;
  char *text1;
  fy_token *fyt2;
  fy_token *fyt1;
  void *userdata_local;
  void *key2_local;
  void *key1_local;
  void *hash_local;
  fy_accel *xl_local;
  
  text1 = (char *)key2;
  fyt2 = (fy_token *)key1;
  fyt1 = (fy_token *)userdata;
  userdata_local = key2;
  key2_local = key1;
  key1_local = hash;
  hash_local = xl;
  text2 = fy_token_get_text((fy_token *)key1,&len2);
  if (text2 == (char *)0x0) {
    xl_local._7_1_ = false;
  }
  else {
    len1 = (size_t)fy_token_get_text((fy_token *)text1,&local_68);
    if ((char *)len1 == (char *)0x0) {
      xl_local._7_1_ = false;
    }
    else {
      xl_local._7_1_ = false;
      if (len2 == local_68) {
        iVar1 = memcmp(text2,(void *)len1,len2);
        xl_local._7_1_ = iVar1 == 0;
      }
    }
  }
  return xl_local._7_1_;
}

Assistant:

static bool hd_anchor_eq(struct fy_accel *xl, const void *hash, const void *key1, const void *key2, void *userdata) {
    struct fy_token *fyt1 = (void *) key1, *fyt2 = (void *) key2;
    const char *text1, *text2;
    size_t len1, len2;

    text1 = fy_token_get_text(fyt1, &len1);
    if (!text1)
        return false;
    text2 = fy_token_get_text(fyt2, &len2);
    if (!text2)
        return false;

    return len1 == len2 && !memcmp(text1, text2, len1);
}